

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-type.h
# Opt level: O0

Type wasm::Type::
     getLeastUpperBound<std::unordered_set<wasm::Type,std::hash<wasm::Type>,std::equal_to<wasm::Type>,std::allocator<wasm::Type>>>
               (unordered_set<wasm::Type,_std::hash<wasm::Type>,_std::equal_to<wasm::Type>,_std::allocator<wasm::Type>_>
                *types)

{
  bool bVar1;
  reference pvVar2;
  BasicType local_54;
  uintptr_t local_50;
  Type local_48;
  uintptr_t local_40;
  _Node_iterator_base<wasm::Type,_true> local_38;
  Type local_30;
  Type lub;
  const_iterator end;
  const_iterator it;
  unordered_set<wasm::Type,_std::hash<wasm::Type>,_std::equal_to<wasm::Type>,_std::allocator<wasm::Type>_>
  *types_local;
  
  end = std::
        unordered_set<wasm::Type,_std::hash<wasm::Type>,_std::equal_to<wasm::Type>,_std::allocator<wasm::Type>_>
        ::begin(types);
  lub.id = (uintptr_t)
           std::
           unordered_set<wasm::Type,_std::hash<wasm::Type>,_std::equal_to<wasm::Type>,_std::allocator<wasm::Type>_>
           ::end(types);
  bVar1 = std::__detail::operator==
                    (&end.super__Node_iterator_base<wasm::Type,_true>,
                     (_Node_iterator_base<wasm::Type,_true> *)&lub);
  if (bVar1) {
    Type((Type *)&types_local,none);
  }
  else {
    local_38._M_cur =
         (__node_type *)
         std::__detail::_Node_const_iterator<wasm::Type,_true,_true>::operator++(&end,0);
    pvVar2 = std::__detail::_Node_const_iterator<wasm::Type,_true,_true>::operator*
                       ((_Node_const_iterator<wasm::Type,_true,_true> *)&local_38);
    local_30.id = pvVar2->id;
    while (bVar1 = std::__detail::operator!=
                             (&end.super__Node_iterator_base<wasm::Type,_true>,
                              (_Node_iterator_base<wasm::Type,_true> *)&lub), bVar1) {
      local_48.id = local_30.id;
      pvVar2 = std::__detail::_Node_const_iterator<wasm::Type,_true,_true>::operator*(&end);
      local_50 = pvVar2->id;
      local_40 = (uintptr_t)getLeastUpperBound(local_48,(Type)local_50);
      local_54 = none;
      local_30 = (Type)local_40;
      bVar1 = operator==(&local_30,&local_54);
      if (bVar1) {
        Type((Type *)&types_local,none);
        return (Type)(uintptr_t)types_local;
      }
      std::__detail::_Node_const_iterator<wasm::Type,_true,_true>::operator++(&end);
    }
    types_local = (unordered_set<wasm::Type,_std::hash<wasm::Type>,_std::equal_to<wasm::Type>,_std::allocator<wasm::Type>_>
                   *)local_30.id;
  }
  return (Type)(uintptr_t)types_local;
}

Assistant:

static Type getLeastUpperBound(const T& types) {
    auto it = types.begin(), end = types.end();
    if (it == end) {
      return Type::none;
    }
    Type lub = *it++;
    for (; it != end; ++it) {
      lub = getLeastUpperBound(lub, *it);
      if (lub == Type::none) {
        return Type::none;
      }
    }
    return lub;
  }